

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalHashJoin::GetData
          (PhysicalHashJoin *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  HashJoinGlobalSourceState *this_00;
  HashJoinLocalSourceState *this_01;
  bool bVar1;
  HashJoinGlobalSinkState *sink;
  pointer this_02;
  pointer this_03;
  unique_lock<std::mutex> guard;
  SourceResultType local_61;
  unique_lock<std::mutex> local_60;
  StateWithBlockableTasks *local_50;
  vector<duckdb::InterruptState,_true> *local_48;
  OperatorSourceInput *local_40;
  mutex *local_38;
  
  sink = (HashJoinGlobalSinkState *)
         unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
         operator->(&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                     super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  this_00 = (HashJoinGlobalSourceState *)input->global_state;
  this_01 = (HashJoinLocalSourceState *)input->local_state;
  LOCK();
  (sink->scanned_data)._M_base._M_i = true;
  UNLOCK();
  local_40 = input;
  if ((sink->external == false) &&
     (bVar1 = PropagatesBuildSide((this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                                  super_CachingPhysicalOperator.field_0x81), !bVar1)) {
    local_60._M_device = &(this_00->super_GlobalSourceState).super_StateWithBlockableTasks.lock;
    local_60._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_60);
    local_60._M_owns = true;
    if ((this_00->global_stage)._M_i != DONE) {
      LOCK();
      (this_00->global_stage)._M_i = DONE;
      UNLOCK();
      this_02 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                ::operator->(&sink->hash_table);
      JoinHashTable::Reset(this_02);
      this_03 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                ::operator->(&sink->temporary_memory_state);
      TemporaryMemoryState::SetZero(this_03);
    }
    ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
    return FINISHED;
  }
  if ((this_00->global_stage)._M_i == INIT) {
    HashJoinGlobalSourceState::Initialize(this_00,sink);
  }
  if (((this_00->global_stage)._M_i != DONE) && (chunk->count == 0)) {
    local_50 = &(this_00->super_GlobalSourceState).super_StateWithBlockableTasks;
    local_38 = &(this_00->super_GlobalSourceState).super_StateWithBlockableTasks.lock;
    local_48 = &(this_00->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks;
    do {
      bVar1 = HashJoinLocalSourceState::TaskFinished(this_01);
      if ((!bVar1) || (bVar1 = HashJoinGlobalSourceState::AssignTask(this_00,sink,this_01), bVar1))
      {
        HashJoinLocalSourceState::ExecuteTask(this_01,sink,this_00,chunk);
      }
      else {
        local_60._M_device = local_38;
        local_60._M_owns = false;
        ::std::unique_lock<std::mutex>::lock(&local_60);
        local_60._M_owns = true;
        bVar1 = HashJoinGlobalSourceState::TryPrepareNextStage(this_00,sink);
        if ((bVar1) || ((this_00->global_stage)._M_i == DONE)) {
          bVar1 = true;
          StateWithBlockableTasks::UnblockTasks(local_50,&local_60);
        }
        else {
          if (((local_50->can_block)._M_base._M_i & 1U) == 0) {
            local_61 = FINISHED;
          }
          else {
            ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::
            push_back(&local_48->
                       super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                      ,local_40->interrupt_state);
            local_61 = BLOCKED;
          }
          bVar1 = false;
        }
        ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
        if (!bVar1) {
          return local_61;
        }
      }
    } while (((this_00->global_stage)._M_i != DONE) && (chunk->count == 0));
  }
  return chunk->count == 0;
}

Assistant:

SourceResultType PhysicalHashJoin::GetData(ExecutionContext &context, DataChunk &chunk,
                                           OperatorSourceInput &input) const {
	auto &sink = sink_state->Cast<HashJoinGlobalSinkState>();
	auto &gstate = input.global_state.Cast<HashJoinGlobalSourceState>();
	auto &lstate = input.local_state.Cast<HashJoinLocalSourceState>();
	sink.scanned_data = true;

	if (!sink.external && !PropagatesBuildSide(join_type)) {
		auto guard = gstate.Lock();
		if (gstate.global_stage != HashJoinSourceStage::DONE) {
			gstate.global_stage = HashJoinSourceStage::DONE;
			sink.hash_table->Reset();
			sink.temporary_memory_state->SetZero();
		}
		return SourceResultType::FINISHED;
	}

	if (gstate.global_stage == HashJoinSourceStage::INIT) {
		gstate.Initialize(sink);
	}

	// Any call to GetData must produce tuples, otherwise the pipeline executor thinks that we're done
	// Therefore, we loop until we've produced tuples, or until the operator is actually done
	while (gstate.global_stage != HashJoinSourceStage::DONE && chunk.size() == 0) {
		if (!lstate.TaskFinished() || gstate.AssignTask(sink, lstate)) {
			lstate.ExecuteTask(sink, gstate, chunk);
		} else {
			auto guard = gstate.Lock();
			if (gstate.TryPrepareNextStage(sink) || gstate.global_stage == HashJoinSourceStage::DONE) {
				gstate.UnblockTasks(guard);
			} else {
				return gstate.BlockSource(guard, input.interrupt_state);
			}
		}
	}

	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}